

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O0

void __thiscall
powerpc_test_cpu::test_instruction_RRRII(powerpc_test_cpu *this,char *insn,uint32_t opcode)

{
  uint32_t value;
  uint32_t uVar1;
  int iVar2;
  uint32_t local_50;
  uint32_t rb;
  int j;
  uint32_t ra;
  int i;
  uint32_t me;
  int i_me;
  uint32_t mb;
  int i_mb;
  int n_msk_values;
  int n_reg_values;
  uint32_t local_1c;
  char *pcStack_18;
  uint32_t opcode_local;
  char *insn_local;
  powerpc_test_cpu *this_local;
  
  local_1c = opcode;
  pcStack_18 = insn;
  insn_local = (char *)this;
  if (test_instruction_RRRII(char_const*,unsigned_int)::code == '\0') {
    iVar2 = __cxa_guard_acquire();
    if (iVar2 != 0) {
      test_instruction_RRRII::code[0] = 0;
      test_instruction_RRRII::code[1] = 0x4e800020;
      test_instruction_RRRII::code[2] = POWERPC_MR(0,4);
      test_instruction_RRRII::code[3] = 0;
      test_instruction_RRRII::code[4] = 0x4e800020;
      __cxa_guard_release(&test_instruction_RRRII(char_const*,unsigned_int)::code);
    }
  }
  for (i_me = 0; i_me < 4; i_me = i_me + 1) {
    value = msk_values[i_me];
    for (i = 0; i < 4; i = i + 1) {
      uVar1 = msk_values[i];
      bit_field<21,_25>::insert(&local_1c,value);
      bit_field<26,_30>::insert(&local_1c,uVar1);
      test_instruction_RRRII::code[0] = local_1c;
      test_instruction_RRRII::code[3] = local_1c;
      bit_field<11,_15>::insert(test_instruction_RRRII::code + 3,0);
      flush_icache_range(this,test_instruction_RRRII::code,0x14);
      for (j = 0; j < 0x24; j = j + 1) {
        uVar1 = reg_values[j];
        for (local_50 = 0xffffffff; (int)local_50 < 0x22; local_50 = local_50 + 1) {
          test_one(this,test_instruction_RRRII::code,pcStack_18,uVar1,local_50,0,0);
          test_one(this,test_instruction_RRRII::code + 2,pcStack_18,uVar1,local_50,0,0);
        }
      }
    }
  }
  return;
}

Assistant:

void powerpc_test_cpu::test_instruction_RRRII(const char *insn, uint32_t opcode)
{
	// Test code
	static uint32_t code[] = {
		POWERPC_ILLEGAL, POWERPC_BLR,
		POWERPC_MR(0, RA), POWERPC_ILLEGAL, POWERPC_BLR
	};

	// Input values
	const int n_reg_values = sizeof(reg_values)/sizeof(reg_values[0]);
	const int n_msk_values = sizeof(msk_values)/sizeof(msk_values[0]);

	for (int i_mb = 0; i_mb < n_msk_values; i_mb++) {
		const uint32_t mb = msk_values[i_mb];
		for (int i_me = 0; i_me < n_msk_values; i_me++) {
			const uint32_t me = msk_values[i_me];
			MB_field::insert(opcode, mb);
			ME_field::insert(opcode, me);
			code[0] = opcode;
			code[3] = opcode;
			rA_field::insert(code[3], 0);
			flush_icache_range(code, sizeof(code));
			for (int i = 0; i < n_reg_values; i++) {
				const uint32_t ra = reg_values[i];
				for (int j = -1; j <= 33; j++) {
					const uint32_t rb = j;
					test_one(&code[0], insn, ra, rb, 0, 0);
					test_one(&code[2], insn, ra, rb, 0, 0);
				}
			}
		}
	}
}